

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O2

void __thiscall irr::scene::CMeshSceneNode::render(CMeshSceneNode *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  undefined4 extraout_var;
  undefined8 *puVar10;
  long lVar11;
  undefined4 extraout_var_01;
  undefined8 uVar12;
  u32 g;
  long lVar13;
  u32 i;
  ulong uVar14;
  u32 i_1;
  uint uVar15;
  SMaterial m;
  float *pfVar9;
  undefined4 extraout_var_00;
  
  plVar8 = (long *)(**(code **)(**(long **)&this->field_0xc8 + 0x10))();
  if ((plVar8 != (long *)0x0) && (this->Mesh != (IMesh *)0x0)) {
    iVar5 = (**(code **)(**(long **)&this->field_0xc8 + 0xe0))();
    this->PassCount = this->PassCount + 1;
    (**(code **)(*plVar8 + 0x30))(plVar8,1,&this->field_0x30);
    iVar6 = (*this->Mesh->_vptr_IMesh[3])();
    pfVar9 = (float *)CONCAT44(extraout_var,iVar6);
    fVar1 = pfVar9[1];
    fVar2 = pfVar9[2];
    fVar3 = pfVar9[3];
    (this->Box).MinEdge.X = *pfVar9;
    (this->Box).MinEdge.Y = fVar1;
    (this->Box).MinEdge.Z = fVar2;
    (this->Box).MaxEdge.X = fVar3;
    fVar1 = pfVar9[5];
    (this->Box).MaxEdge.Y = pfVar9[4];
    (this->Box).MaxEdge.Z = fVar1;
    lVar13 = 0;
    uVar14 = 0;
    while( true ) {
      uVar7 = (**this->Mesh->_vptr_IMesh)();
      if (uVar7 <= uVar14) break;
      iVar6 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar14 & 0xffffffff);
      puVar10 = (undefined8 *)CONCAT44(extraout_var_00,iVar6);
      if (puVar10 != (undefined8 *)0x0) {
        if (this->ReadOnlyMaterials == true) {
          lVar11 = (**(code **)*puVar10)(puVar10);
        }
        else {
          lVar11 = (long)&((this->Materials).m_data.
                           super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start)->TextureLayers[0].Texture +
                   lVar13;
        }
        cVar4 = (**(code **)(*plVar8 + 0x338))(plVar8,lVar11);
        if ((iVar5 != 0x10) != (bool)cVar4) {
          (**(code **)(*plVar8 + 0x60))(plVar8,lVar11);
          (**(code **)(*plVar8 + 0x1b0))(plVar8,puVar10);
        }
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0xb8;
    }
    if ((*(int *)&this->field_0xd8 != 0) && (this->PassCount == 1)) {
      video::SMaterial::SMaterial(&m);
      m._176_1_ = m._176_1_ & 0xf7;
      m.AntiAliasing = '\0';
      (**(code **)(*plVar8 + 0x60))(plVar8,&m);
      uVar7 = *(uint *)&this->field_0xd8;
      if ((uVar7 & 1) != 0) {
        (**(code **)(*plVar8 + 0x170))(plVar8,&this->Box,0xffffffffffffffff);
        uVar7 = *(uint *)&this->field_0xd8;
      }
      if ((uVar7 & 0x20) != 0) {
        uVar14 = 0;
        while( true ) {
          uVar7 = (**this->Mesh->_vptr_IMesh)();
          if (uVar7 <= (uint)uVar14) break;
          iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar14);
          uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x50))
                             ((long *)CONCAT44(extraout_var_01,iVar5));
          (**(code **)(*plVar8 + 0x170))(plVar8,uVar12,0xffbe8080);
          uVar14 = (ulong)((uint)uVar14 + 1);
        }
        uVar7 = *(uint *)&this->field_0xd8;
      }
      if ((uVar7 & 2) != 0) {
        uVar7 = (**this->Mesh->_vptr_IMesh)();
        for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
          iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)uVar15);
          (**(code **)(*plVar8 + 0x1b8))(0x3f800000,plVar8,iVar5,0xff22dddd);
        }
        uVar7 = *(uint *)&this->field_0xd8;
      }
      if ((uVar7 & 8) != 0) {
        m._176_1_ = m._176_1_ | 1;
        (**(code **)(*plVar8 + 0x60))();
        uVar7 = 0;
        while( true ) {
          uVar15 = (**this->Mesh->_vptr_IMesh)();
          if (uVar15 <= uVar7) break;
          iVar5 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)uVar7);
          (**(code **)(*plVar8 + 0x1b0))(plVar8,iVar5);
          uVar7 = uVar7 + 1;
        }
      }
      video::SMaterial::~SMaterial(&m);
    }
  }
  return;
}

Assistant:

void CMeshSceneNode::render()
{
	video::IVideoDriver *driver = SceneManager->getVideoDriver();

	if (!Mesh || !driver)
		return;

	const bool isTransparentPass =
			SceneManager->getSceneNodeRenderPass() == scene::ESNRP_TRANSPARENT;

	++PassCount;

	driver->setTransform(video::ETS_WORLD, AbsoluteTransformation);
	Box = Mesh->getBoundingBox();

	for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
		scene::IMeshBuffer *mb = Mesh->getMeshBuffer(i);
		if (mb) {
			const video::SMaterial &material = ReadOnlyMaterials ? mb->getMaterial() : Materials[i];

			const bool transparent = driver->needsTransparentRenderPass(material);

			// only render transparent buffer if this is the transparent render pass
			// and solid only in solid pass
			if (transparent == isTransparentPass) {
				driver->setMaterial(material);
				driver->drawMeshBuffer(mb);
			}
		}
	}

	// for debug purposes only:
	if (DebugDataVisible && PassCount == 1) {
		video::SMaterial m;
		m.Lighting = false;
		m.AntiAliasing = 0;
		driver->setMaterial(m);

		if (DebugDataVisible & scene::EDS_BBOX) {
			driver->draw3DBox(Box, video::SColor(255, 255, 255, 255));
		}
		if (DebugDataVisible & scene::EDS_BBOX_BUFFERS) {
			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->draw3DBox(
						Mesh->getMeshBuffer(g)->getBoundingBox(),
						video::SColor(255, 190, 128, 128));
			}
		}

		if (DebugDataVisible & scene::EDS_NORMALS) {
			// draw normals
			const f32 debugNormalLength = 1.f;
			const video::SColor debugNormalColor = video::SColor(255, 34, 221, 221);
			const u32 count = Mesh->getMeshBufferCount();

			for (u32 i = 0; i != count; ++i) {
				driver->drawMeshBufferNormals(Mesh->getMeshBuffer(i), debugNormalLength, debugNormalColor);
			}
		}

		// show mesh
		if (DebugDataVisible & scene::EDS_MESH_WIRE_OVERLAY) {
			m.Wireframe = true;
			driver->setMaterial(m);

			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->drawMeshBuffer(Mesh->getMeshBuffer(g));
			}
		}
	}
}